

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDepends
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TargetType TVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  cmLocalGenerator *this_00;
  char *__s;
  long *plVar7;
  TargetDependSet *pTVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  size_type *psVar11;
  pointer pbVar12;
  _Rb_tree_header *p_Var13;
  string d;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  string local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  long *local_58 [2];
  long local_48 [2];
  _Base_ptr local_38;
  
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs;
  TVar5 = cmGeneratorTarget::GetType(target);
  if (TVar5 == GLOBAL_TARGET) {
    psVar6 = cmGeneratorTarget::GetUtilities_abi_cxx11_(target);
    local_88 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (local_88 != local_38) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_80 + 0x10);
      do {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        __s = cmLocalGenerator::GetCurrentBinaryDirectory(this_00);
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"/","");
        strlen(__s);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,(ulong)__s);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_80.field_2._M_allocated_capacity = *psVar11;
          local_80.field_2._8_8_ = plVar7[3];
          local_80._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar11;
          local_80._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_80._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_80,*(ulong *)(local_88 + 1))
        ;
        pbVar12 = (pointer)(plVar7 + 2);
        if ((pointer)*plVar7 == pbVar12) {
          local_a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
          local_a8._24_8_ = plVar7[3];
          local_a8._0_8_ = (pointer)(local_a8 + 0x10);
        }
        else {
          local_a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
          local_a8._0_8_ = (pointer)*plVar7;
        }
        local_a8._8_8_ = plVar7[1];
        *plVar7 = (long)pbVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        ConvertToNinjaPath(&local_80,this,(string *)local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_60,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        local_88 = (_Base_ptr)std::_Rb_tree_increment(local_88);
      } while (local_88 != local_38);
    }
  }
  else {
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    pTVar8 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    p_Var9 = (pTVar8->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(pTVar8->
               super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               )._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var13) {
      pbVar12 = (pointer)0x0;
    }
    else {
      do {
        TVar5 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var9 + 1));
        if (TVar5 != INTERFACE_LIBRARY) {
          AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var9 + 1),(cmNinjaDeps *)local_a8,
                              depends);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        uVar4 = local_a8._8_8_;
        uVar3 = local_a8._0_8_;
      } while ((_Rb_tree_header *)p_Var9 != p_Var13);
      pbVar12 = (pointer)local_a8._0_8_;
      if (local_a8._0_8_ != local_a8._8_8_) {
        uVar10 = (long)(local_a8._8_8_ - local_a8._0_8_) >> 5;
        lVar1 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_a8._0_8_,local_a8._8_8_,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar3,uVar4);
        pbVar12 = (pointer)local_a8._0_8_;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_60,*(undefined8 *)(local_60 + 8),pbVar12,local_a8._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDepends(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  if (target->GetType() == cmStateEnums::GLOBAL_TARGET) {
    // These depend only on other CMake-provided targets, e.g. "all".
    std::set<std::string> const& utils = target->GetUtilities();
    for (std::set<std::string>::const_iterator i = utils.begin();
         i != utils.end(); ++i) {
      std::string d =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() +
        std::string("/") + *i;
      outputs.push_back(this->ConvertToNinjaPath(d));
    }
  } else {
    cmNinjaDeps outs;
    cmTargetDependSet const& targetDeps = this->GetTargetDirectDepends(target);
    for (cmTargetDependSet::const_iterator i = targetDeps.begin();
         i != targetDeps.end(); ++i) {
      if ((*i)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->AppendTargetOutputs(*i, outs, depends);
    }
    std::sort(outs.begin(), outs.end());
    outputs.insert(outputs.end(), outs.begin(), outs.end());
  }
}